

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeIncrFree(IncrMerger *pIncr)

{
  sqlite3_file *psVar1;
  
  if (pIncr != (IncrMerger *)0x0) {
    if (pIncr->bUseThread != 0) {
      vdbeSorterJoinThread(pIncr->pTask);
      psVar1 = pIncr->aFile[0].pFd;
      if (psVar1 != (sqlite3_file *)0x0) {
        if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar1->pMethods->xClose)(psVar1);
          psVar1->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar1);
      }
      psVar1 = pIncr->aFile[1].pFd;
      if (psVar1 != (sqlite3_file *)0x0) {
        if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar1->pMethods->xClose)(psVar1);
          psVar1->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar1);
      }
    }
    vdbeMergeEngineFree(pIncr->pMerger);
    sqlite3_free(pIncr);
    return;
  }
  return;
}

Assistant:

static void vdbeIncrFree(IncrMerger *pIncr){
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      vdbeSorterJoinThread(pIncr->pTask);
      if( pIncr->aFile[0].pFd ) sqlite3OsCloseFree(pIncr->aFile[0].pFd);
      if( pIncr->aFile[1].pFd ) sqlite3OsCloseFree(pIncr->aFile[1].pFd);
    }
#endif
    vdbeMergeEngineFree(pIncr->pMerger);
    sqlite3_free(pIncr);
  }
}